

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

int xmllintMain(int argc,char **argv,FILE *errStream,xmlResourceLoader loader)

{
  bool bVar1;
  FILE *__stream;
  __off_t _Var2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int extraout_EAX;
  unsigned_long uVar6;
  int *piVar7;
  char *pcVar8;
  undefined8 *puVar9;
  long lVar10;
  char *pcVar11;
  xmlTextReaderPtr pxVar12;
  xmlTextReaderPtr reader;
  xmlParserCtxtPtr pxVar13;
  xmlParserCtxtPtr pxVar14;
  long lVar15;
  xmlSAXHandler *__src;
  size_t __size;
  int iVar16;
  int iVar17;
  xmllintState state;
  timeval tv;
  uint local_43c;
  int local_438;
  xmllintState local_430;
  stat64 local_c0;
  
  memset(&local_430,0,0x370);
  local_430.repeat = 1;
  local_430.progresult = XMLLINT_RETURN_OK;
  local_430.options = 0x410000;
  local_430.errStream = errStream;
  local_430.defaultResourceLoader = loader;
  if (1 < argc) {
    iVar16 = 1;
LAB_00105ea9:
    pcVar8 = argv[iVar16];
    if ((*pcVar8 == '-') && (pcVar8[1] != '\0')) {
      iVar3 = strcmp(pcVar8,"-maxmem");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--maxmem"), iVar3 == 0)) {
        iVar16 = iVar16 + 1;
        if (argc <= iVar16) {
          pcVar8 = "maxmem: missing integer value\n";
          __size = 0x1e;
LAB_00106fa8:
          fwrite(pcVar8,__size,1,(FILE *)errStream);
          goto LAB_00105e7a;
        }
        piVar7 = __errno_location();
        *piVar7 = 0;
        uVar6 = parseInteger(errStream,"maxmem",argv[iVar16],0,0x7fffffff);
        local_430.maxmem = (int)uVar6;
      }
      else {
        iVar3 = strcmp(pcVar8,"-debug");
        if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--debug"), iVar3 == 0)) {
          local_430.debug = 1;
        }
        else {
          iVar3 = strcmp(pcVar8,"-shell");
          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--shell"), iVar3 == 0)) {
            local_430.shell = 1;
          }
          else {
            iVar3 = strcmp(pcVar8,"-copy");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--copy"), iVar3 == 0)) {
              local_430.copy = 1;
            }
            else {
              iVar3 = strcmp(pcVar8,"-recover");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--recover"), iVar3 == 0)) {
                local_430.options = local_430.options | 1;
              }
              else {
                iVar3 = strcmp(pcVar8,"-huge");
                if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--huge"), iVar3 == 0)) {
                  local_430.options = local_430.options | 0x80000;
                }
                else {
                  iVar3 = strcmp(pcVar8,"-noent");
                  if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--noent"), iVar3 == 0)) {
                    local_430.options = local_430.options | 2;
                  }
                  else {
                    iVar3 = strcmp(pcVar8,"-noenc");
                    if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--noenc"), iVar3 == 0)) {
                      local_430.options = local_430.options | 0x200000;
                    }
                    else {
                      iVar3 = strcmp(pcVar8,"-nsclean");
                      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--nsclean"), iVar3 == 0)) {
                        local_430.options = local_430.options | 0x2000;
                      }
                      else {
                        iVar3 = strcmp(pcVar8,"-nocdata");
                        if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--nocdata"), iVar3 == 0)) {
                          local_430.options = local_430.options | 0x4000;
                        }
                        else {
                          iVar3 = strcmp(pcVar8,"-nodict");
                          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--nodict"), iVar3 == 0)) {
                            local_430.options = local_430.options | 0x1000;
                          }
                          else {
                            iVar3 = strcmp(pcVar8,"-version");
                            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--version"), iVar3 == 0)) {
                              showVersion(errStream,*argv);
                              local_430.version = 1;
                            }
                            else {
                              iVar3 = strcmp(pcVar8,"-noout");
                              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--noout"), iVar3 == 0)) {
                                local_430.noout = 1;
                              }
                              else {
                                iVar3 = strcmp(pcVar8,"-htmlout");
                                if ((iVar3 == 0) || (iVar3 = strcmp(pcVar8,"--htmlout"), iVar3 == 0)
                                   ) {
                                  local_430.htmlout = 1;
                                }
                                else {
                                  iVar3 = strcmp(pcVar8,"-nowrap");
                                  if ((iVar3 == 0) ||
                                     (iVar3 = strcmp(pcVar8,"--nowrap"), iVar3 == 0)) {
                                    local_430.nowrap = 1;
                                  }
                                  else {
                                    iVar3 = strcmp(pcVar8,"-html");
                                    if ((iVar3 == 0) ||
                                       (iVar3 = strcmp(pcVar8,"--html"), iVar3 == 0)) {
                                      local_430.html = 1;
                                    }
                                    else {
                                      iVar3 = strcmp(pcVar8,"-xmlout");
                                      if ((iVar3 == 0) ||
                                         (iVar3 = strcmp(pcVar8,"--xmlout"), iVar3 == 0)) {
                                        local_430.xmlout = 1;
                                      }
                                      else {
                                        iVar3 = strcmp(pcVar8,"-nodefdtd");
                                        if ((((iVar3 == 0) ||
                                             (iVar3 = strcmp(pcVar8,"--nodefdtd"), iVar3 == 0)) ||
                                            (iVar3 = strcmp(pcVar8,"-loaddtd"), iVar3 == 0)) ||
                                           (iVar3 = strcmp(pcVar8,"--loaddtd"), iVar3 == 0)) {
LAB_00106bd9:
                                          local_430.options = local_430.options | 4;
                                        }
                                        else {
                                          iVar3 = strcmp(pcVar8,"-dtdattr");
                                          if ((iVar3 == 0) ||
                                             (iVar3 = strcmp(pcVar8,"--dtdattr"), iVar3 == 0)) {
                                            local_430.options = local_430.options | 8;
                                          }
                                          else {
                                            iVar3 = strcmp(pcVar8,"-valid");
                                            if ((iVar3 == 0) ||
                                               (iVar3 = strcmp(pcVar8,"--valid"), iVar3 == 0)) {
                                              local_430.options = local_430.options | 0x10;
                                            }
                                            else {
                                              iVar3 = strcmp(pcVar8,"-postvalid");
                                              if ((iVar3 == 0) ||
                                                 (iVar3 = strcmp(pcVar8,"--postvalid"), iVar3 == 0))
                                              {
                                                local_430.postvalid = 1;
                                                goto LAB_00106bd9;
                                              }
                                              iVar3 = strcmp(pcVar8,"-dtdvalid");
                                              if ((iVar3 == 0) ||
                                                 (iVar3 = strcmp(pcVar8,"--dtdvalid"), iVar3 == 0))
                                              {
                                                local_430.dtdvalid = argv[(long)iVar16 + 1];
                                              }
                                              else {
                                                iVar3 = strcmp(pcVar8,"-dtdvalidfpi");
                                                if ((iVar3 != 0) &&
                                                   (iVar3 = strcmp(pcVar8,"--dtdvalidfpi"),
                                                   iVar3 != 0)) {
                                                  iVar3 = strcmp(pcVar8,"-insert");
                                                  if ((iVar3 == 0) ||
                                                     (iVar3 = strcmp(pcVar8,"--insert"), iVar3 == 0)
                                                     ) {
                                                    local_430.insert = 1;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar8,"-dropdtd");
                                                    if ((iVar3 == 0) ||
                                                       (iVar3 = strcmp(pcVar8,"--dropdtd"),
                                                       iVar3 == 0)) {
                                                      local_430.dropdtd = 1;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar8,"-quiet");
                                                      if ((iVar3 == 0) ||
                                                         (iVar3 = strcmp(pcVar8,"--quiet"),
                                                         iVar3 == 0)) {
                                                        local_430.quiet = 1;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar8,"-timing");
                                                        if ((iVar3 == 0) ||
                                                           (iVar3 = strcmp(pcVar8,"--timing"),
                                                           iVar3 == 0)) {
                                                          local_430.timing = 1;
                                                        }
                                                        else {
                                                          iVar3 = strcmp(pcVar8,"-auto");
                                                          if ((iVar3 == 0) ||
                                                             (iVar3 = strcmp(pcVar8,"--auto"),
                                                             iVar3 == 0)) {
                                                            local_430.generate = 1;
                                                          }
                                                          else {
                                                            iVar3 = strcmp(pcVar8,"-repeat");
                                                            if ((iVar3 == 0) ||
                                                               (iVar3 = strcmp(pcVar8,"--repeat"),
                                                               iVar3 == 0)) {
                                                              if (local_430.repeat < 2) {
                                                                local_430.repeat = 100;
                                                              }
                                                              else {
                                                                local_430.repeat =
                                                                     local_430.repeat * 10;
                                                              }
                                                            }
                                                            else {
                                                              iVar3 = strcmp(pcVar8,"-push");
                                                              if ((iVar3 == 0) ||
                                                                 (iVar3 = strcmp(pcVar8,"--push"),
                                                                 iVar3 == 0)) {
                                                                local_430.push = 1;
                                                              }
                                                              else {
                                                                iVar3 = strcmp(pcVar8,"-memory");
                                                                if ((iVar3 == 0) ||
                                                                   (iVar3 = strcmp(pcVar8,"--memory"
                                                                                  ), iVar3 == 0)) {
                                                                  local_430.memory = 1;
                                                                }
                                                                else {
                                                                  iVar3 = strcmp(pcVar8,"-testIO");
                                                                  if ((iVar3 == 0) ||
                                                                     (iVar3 = strcmp(pcVar8,
                                                  "--testIO"), iVar3 == 0)) {
                                                    local_430.testIO = 1;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar8,"-xinclude");
                                                    if ((iVar3 == 0) ||
                                                       (iVar3 = strcmp(pcVar8,"--xinclude"),
                                                       iVar3 == 0)) {
                                                      local_430.xinclude = 1;
                                                      local_430.options = local_430.options | 0x400;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar8,"-noxincludenode");
                                                      if ((iVar3 == 0) ||
                                                         (iVar3 = strcmp(pcVar8,"--noxincludenode"),
                                                         iVar3 == 0)) {
                                                        local_430.xinclude = 1;
                                                        local_430.options =
                                                             local_430.options | 0x8400;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar8,"-nofixup-base-uris");
                                                        if ((iVar3 == 0) ||
                                                           (iVar3 = strcmp(pcVar8,
                                                  "--nofixup-base-uris"), iVar3 == 0)) {
                                                    local_430.xinclude = 1;
                                                    local_430.options = local_430.options | 0x40400;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar8,"-nowarning");
                                                    if ((iVar3 == 0) ||
                                                       (iVar3 = strcmp(pcVar8,"--nowarning"),
                                                       iVar3 == 0)) {
                                                      local_430.options =
                                                           local_430.options & 0xffffff3fU | 0x40;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar8,"-pedantic");
                                                      if ((iVar3 == 0) ||
                                                         (iVar3 = strcmp(pcVar8,"--pedantic"),
                                                         iVar3 == 0)) {
                                                        local_430.options =
                                                             local_430.options & 0xffffff3fU | 0x80;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar8,"-debugent");
                                                        if ((iVar3 != 0) &&
                                                           (iVar3 = strcmp(pcVar8,"--debugent"),
                                                           iVar3 != 0)) {
                                                          iVar3 = strcmp(pcVar8,"-c14n");
                                                          if ((iVar3 == 0) ||
                                                             (iVar3 = strcmp(pcVar8,"--c14n"),
                                                             iVar3 == 0)) {
                                                            local_430.canonical = 1;
                                                          }
                                                          else {
                                                            iVar3 = strcmp(pcVar8,"-c14n11");
                                                            if ((iVar3 == 0) ||
                                                               (iVar3 = strcmp(pcVar8,"--c14n11"),
                                                               iVar3 == 0)) {
                                                              local_430.canonical_11 = 1;
                                                            }
                                                            else {
                                                              iVar3 = strcmp(pcVar8,"-exc-c14n");
                                                              if ((iVar3 != 0) &&
                                                                 (iVar3 = strcmp(pcVar8,"--exc-c14n"
                                                                                ), iVar3 != 0)) {
                                                                iVar3 = strcmp(pcVar8,"-catalogs");
                                                                if ((iVar3 == 0) ||
                                                                   (iVar3 = strcmp(pcVar8,
                                                  "--catalogs"), iVar3 == 0)) {
                                                    local_430.catalogs = 1;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar8,"-nocatalogs");
                                                    if ((iVar3 == 0) ||
                                                       (iVar3 = strcmp(pcVar8,"--nocatalogs"),
                                                       iVar3 == 0)) {
                                                      local_430.nocatalogs = 1;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar8,"-noblanks");
                                                      if ((iVar3 == 0) ||
                                                         (iVar3 = strcmp(pcVar8,"--noblanks"),
                                                         iVar3 == 0)) {
LAB_00106dbd:
                                                        local_430.options =
                                                             local_430.options | 0x100;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar8,"-o");
                                                        if ((iVar3 == 0) ||
                                                           ((iVar3 = strcmp(pcVar8,"-output"),
                                                            iVar3 == 0 ||
                                                            (iVar3 = strcmp(pcVar8,"--output"),
                                                            iVar3 == 0)))) {
                                                          local_430.output = argv[(long)iVar16 + 1];
                                                          iVar16 = iVar16 + 1;
                                                        }
                                                        else {
                                                          iVar3 = strcmp(pcVar8,"-format");
                                                          if ((iVar3 == 0) ||
                                                             (iVar3 = strcmp(pcVar8,"--format"),
                                                             iVar3 == 0)) {
                                                            local_430.format = 1;
                                                            goto LAB_00106dbd;
                                                          }
                                                          iVar3 = strcmp(pcVar8,"-encode");
                                                          if ((iVar3 == 0) ||
                                                             (iVar3 = strcmp(pcVar8,"--encode"),
                                                             iVar3 == 0)) {
                                                            local_430.encoding =
                                                                 argv[(long)iVar16 + 1];
                                                            iVar16 = iVar16 + 1;
                                                          }
                                                          else {
                                                            iVar3 = strcmp(pcVar8,"-pretty");
                                                            if ((iVar3 == 0) ||
                                                               (iVar3 = strcmp(pcVar8,"--pretty"),
                                                               iVar3 == 0)) {
                                                              iVar3 = iVar16 + 1;
                                                              lVar10 = (long)iVar16;
                                                              iVar16 = iVar3;
                                                              if (argv[lVar10 + 1] != (char *)0x0) {
                                                                local_430.format =
                                                                     atoi(argv[lVar10 + 1]);
                                                              }
                                                            }
                                                            else {
                                                              iVar3 = strcmp(pcVar8,"-stream");
                                                              if ((iVar3 == 0) ||
                                                                 (iVar3 = strcmp(pcVar8,"--stream"),
                                                                 iVar3 == 0)) {
                                                                local_430.stream = 1;
                                                              }
                                                              else {
                                                                iVar3 = strcmp(pcVar8,"-walker");
                                                                if ((iVar3 == 0) ||
                                                                   (iVar3 = strcmp(pcVar8,"--walker"
                                                                                  ), iVar3 == 0)) {
                                                                  local_430.walker = 1;
                                                                  local_430.noout = 1;
                                                                }
                                                                else {
                                                                  iVar3 = strcmp(pcVar8,"-pattern");
                                                                  if ((iVar3 == 0) ||
                                                                     (iVar3 = strcmp(pcVar8,
                                                  "--pattern"), iVar3 == 0)) {
                                                    local_430.pattern = argv[(long)iVar16 + 1];
                                                    iVar16 = iVar16 + 1;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar8,"-sax1");
                                                    if ((iVar3 == 0) ||
                                                       (iVar3 = strcmp(pcVar8,"--sax1"), iVar3 == 0)
                                                       ) {
                                                      local_430.options = local_430.options | 0x200;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar8,"-sax");
                                                      if ((iVar3 != 0) &&
                                                         (iVar3 = strcmp(pcVar8,"--sax"), iVar3 != 0
                                                         )) {
                                                        iVar3 = strcmp(pcVar8,"-relaxng");
                                                        if ((iVar3 == 0) ||
                                                           (iVar3 = strcmp(pcVar8,"--relaxng"),
                                                           iVar3 == 0)) {
                                                          local_430.relaxng = argv[(long)iVar16 + 1]
                                                          ;
                                                        }
                                                        else {
                                                          iVar3 = strcmp(pcVar8,"-schema");
                                                          if ((iVar3 == 0) ||
                                                             (iVar3 = strcmp(pcVar8,"--schema"),
                                                             iVar3 == 0)) {
                                                            local_430.schema =
                                                                 argv[(long)iVar16 + 1];
                                                          }
                                                          else {
                                                            iVar3 = strcmp(pcVar8,"-schematron");
                                                            if ((iVar3 != 0) &&
                                                               (iVar3 = strcmp(pcVar8,"--schematron"
                                                                              ), iVar3 != 0)) {
                                                              iVar3 = strcmp(pcVar8,"-nonet");
                                                              if ((iVar3 == 0) ||
                                                                 (iVar3 = strcmp(pcVar8,"--nonet"),
                                                                 iVar3 == 0)) {
                                                                local_430.options =
                                                                     local_430.options | 0x800;
                                                              }
                                                              else {
                                                                iVar3 = strcmp(pcVar8,"-nocompact");
                                                                if ((iVar3 == 0) ||
                                                                   (iVar3 = strcmp(pcVar8,
                                                  "--nocompact"), iVar3 == 0)) {
                                                    local_430.options =
                                                         local_430.options & 0xfffeffff;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar8,"-load-trace");
                                                    if ((iVar3 == 0) ||
                                                       (iVar3 = strcmp(pcVar8,"--load-trace"),
                                                       iVar3 == 0)) {
                                                      local_430.load_trace = 1;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar8,"-path");
                                                      if ((iVar3 == 0) ||
                                                         (iVar3 = strcmp(pcVar8,"--path"),
                                                         iVar3 == 0)) {
                                                        parsePath(&local_430,
                                                                  (xmlChar *)argv[(long)iVar16 + 1])
                                                        ;
                                                        iVar16 = iVar16 + 1;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar8,"-xpath");
                                                        if ((iVar3 == 0) ||
                                                           (iVar3 = strcmp(pcVar8,"--xpath"),
                                                           iVar3 == 0)) {
                                                          local_430.noout = local_430.noout + 1;
                                                          local_430.xpathquery =
                                                               argv[(long)iVar16 + 1];
                                                          iVar16 = iVar16 + 1;
                                                        }
                                                        else {
                                                          iVar3 = strcmp(pcVar8,"-oldxml10");
                                                          if ((iVar3 != 0) &&
                                                             (iVar3 = strcmp(pcVar8,"--oldxml10"),
                                                             iVar3 != 0)) {
                                                            iVar3 = strcmp(pcVar8,"-max-ampl");
                                                            if ((iVar3 == 0) ||
                                                               (iVar3 = strcmp(pcVar8,"--max-ampl"),
                                                               iVar3 == 0)) {
                                                              iVar16 = iVar16 + 1;
                                                              if (argc <= iVar16) {
                                                                pcVar8 = 
                                                  "max-ampl: missing integer value\n";
                                                  __size = 0x20;
                                                  goto LAB_00106fa8;
                                                  }
                                                  uVar6 = parseInteger(errStream,"max-ampl",
                                                                       argv[iVar16],1,0xffffffff);
                                                  local_430.maxAmpl = (uint)uVar6;
                                                  goto LAB_00106b4c;
                                                  }
                                                  fprintf((FILE *)errStream,"Unknown option %s\n",
                                                          pcVar8);
                                                  pcVar8 = *argv;
                                                  goto LAB_00105e75;
                                                  }
                                                  local_430.options = local_430.options | 0x20000;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00106b4c;
                                                  }
                                                  local_430.schematron = argv[(long)iVar16 + 1];
                                                  }
                                                  }
                                                  local_430.options = local_430.options | 2;
                                                  iVar16 = iVar16 + 1;
                                                  goto LAB_00106b4c;
                                                  }
                                                  local_430.sax = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00106b4c;
                                                  }
                                                  local_430.exc_canonical = 1;
                                                  }
                                                  }
                                                  local_430.options = local_430.options | 0xe;
                                                  goto LAB_00106b4c;
                                                  }
                                                  local_430.debugent = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_00106b4c;
                                                }
                                                local_430.dtdvalidfpi = argv[(long)iVar16 + 1];
                                              }
                                              local_430.options = local_430.options | 4;
                                              iVar16 = iVar16 + 1;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00106b4c:
    iVar16 = iVar16 + 1;
    if (argc <= iVar16) goto LAB_00106f1d;
    goto LAB_00105ea9;
  }
  pcVar8 = *argv;
LAB_00105e75:
  usage(errStream,pcVar8);
LAB_00105e7a:
  local_430.progresult = XMLLINT_ERR_UNCLASS;
  goto switchD_00107f12_caseD_2;
LAB_00106f1d:
  if (local_430.shell != 0) {
    local_430.repeat = 1;
  }
  if (local_430.maxmem != 0) {
    xmllintMaxmemReached = 0;
    xmlMemSetup(myFreeFunc,myMallocFunc,myReallocFunc,myStrdupFunc);
  }
  xmlCheckVersion(0x5398);
  if ((local_430.nocatalogs == 0) && (local_430.catalogs != 0)) {
    pcVar8 = getenv("SGML_CATALOG_FILES");
    if (pcVar8 == (char *)0x0) {
      fwrite("Variable $SGML_CATALOG_FILES not set\n",0x25,1,(FILE *)errStream);
    }
    else {
      xmlLoadCatalogs(pcVar8);
    }
  }
  pcVar8 = getenv("XMLLINT_INDENT");
  if (pcVar8 != (char *)0x0) {
    puVar9 = (undefined8 *)__xmlTreeIndentString();
    *puVar9 = pcVar8;
  }
  if (local_430.htmlout == 0) {
LAB_00107084:
    if (((local_430.schematron == (char *)0x0) || (local_430.sax != 0)) || (local_430.stream != 0))
    {
LAB_0010713c:
      if ((local_430.sax == 0 && local_430.stream == 0) && local_430.relaxng != (char *)0x0) {
        local_430.options = local_430.options | 4;
        if (local_430.timing != 0) {
          gettimeofday((timeval *)&local_c0,(__timezone_ptr_t)0x0);
          local_430.begin.sec = local_c0.st_dev;
          local_430.begin.usec = (int)local_c0.st_ino;
        }
        lVar10 = xmlRelaxNGNewParserCtxt(local_430.relaxng);
        if (lVar10 != 0) {
          xmlRelaxNGSetResourceLoader(lVar10,xmllintResourceLoader,&local_430);
          local_430.relaxngschemas = (xmlRelaxNGPtr)xmlRelaxNGParse(lVar10);
          if (local_430.relaxngschemas == (xmlRelaxNGPtr)0x0) {
            pcVar11 = "Relax-NG schema %s failed to compile\n";
            pcVar8 = local_430.relaxng;
            goto LAB_00108010;
          }
          xmlRelaxNGFreeParserCtxt(lVar10);
LAB_0010728e:
          if (local_430.timing != 0) {
            endTimer(&local_430,"Compiling the schemas");
          }
LAB_001072ab:
          if (((local_430.pattern == (char *)0x0) || (local_430.walker != 0)) ||
             (iVar16 = xmlPatternCompileSafe(local_430.pattern,0,0,0,&local_430.patternc),
             local_430.patternc != (xmlPatternPtr)0x0)) {
            iVar16 = 1;
            local_438 = 0;
            do {
              pcVar8 = argv[iVar16];
              iVar3 = iVar16;
              if ((*pcVar8 == '-') && (iVar3 = strcmp(pcVar8,"-"), iVar3 != 0)) {
                iVar3 = strcmp(pcVar8,"-path");
                uVar4 = 1;
                if ((((((((iVar3 != 0) && (iVar3 = strcmp(pcVar8,"--path"), iVar3 != 0)) &&
                        (iVar3 = strcmp(pcVar8,"-maxmem"), iVar3 != 0)) &&
                       ((iVar3 = strcmp(pcVar8,"--maxmem"), iVar3 != 0 &&
                        (iVar3 = strcmp(pcVar8,"-o"), iVar3 != 0)))) &&
                      (iVar3 = strcmp(pcVar8,"-output"), iVar3 != 0)) &&
                     (((iVar3 = strcmp(pcVar8,"--output"), iVar3 != 0 &&
                       (iVar3 = strcmp(pcVar8,"-encode"), iVar3 != 0)) &&
                      ((iVar3 = strcmp(pcVar8,"--encode"), iVar3 != 0 &&
                       (((iVar3 = strcmp(pcVar8,"-pretty"), iVar3 != 0 &&
                         (iVar3 = strcmp(pcVar8,"--pretty"), iVar3 != 0)) &&
                        (iVar3 = strcmp(pcVar8,"-dtdvalid"), iVar3 != 0)))))))) &&
                    (((iVar3 = strcmp(pcVar8,"--dtdvalid"), iVar3 != 0 &&
                      (iVar3 = strcmp(pcVar8,"-dtdvalidfpi"), iVar3 != 0)) &&
                     ((iVar3 = strcmp(pcVar8,"--dtdvalidfpi"), iVar3 != 0 &&
                      (((((iVar3 = strcmp(pcVar8,"-relaxng"), iVar3 != 0 &&
                          (iVar3 = strcmp(pcVar8,"--relaxng"), iVar3 != 0)) &&
                         ((iVar3 = strcmp(pcVar8,"-schema"), iVar3 != 0 &&
                          (((iVar3 = strcmp(pcVar8,"--schema"), iVar3 != 0 &&
                            (iVar3 = strcmp(pcVar8,"-schematron"), iVar3 != 0)) &&
                           (iVar3 = strcmp(pcVar8,"--schematron"), iVar3 != 0)))))) &&
                        ((iVar3 = strcmp(pcVar8,"-pattern"), iVar3 != 0 &&
                         (iVar3 = strcmp(pcVar8,"--pattern"), iVar3 != 0)))) &&
                       (iVar3 = strcmp(pcVar8,"-xpath"), iVar3 != 0)))))))) &&
                   ((iVar3 = strcmp(pcVar8,"--xpath"), iVar3 != 0 &&
                    (iVar3 = strcmp(pcVar8,"-max-ampl"), iVar3 != 0)))) {
                  iVar3 = strcmp(pcVar8,"--max-ampl");
                  uVar4 = (uint)(iVar3 == 0);
                }
                iVar16 = iVar16 + uVar4;
                uVar4 = 5;
              }
              else {
                if (local_430.memory == 0) {
                  local_43c = 0xffffffff;
                }
                else {
                  uVar4 = stat64(pcVar8,&local_c0);
                  if ((int)uVar4 < 0) {
                    local_43c = 0xffffffff;
LAB_00107655:
                    local_430.progresult = XMLLINT_ERR_RDFILE;
                    pcVar11 = (char *)(ulong)uVar4;
                    uVar4 = 3;
                    bVar1 = false;
                  }
                  else {
                    uVar4 = open64(pcVar8,0);
                    _Var2 = local_c0.st_size;
                    local_43c = uVar4;
                    if ((int)uVar4 < 0) goto LAB_00107655;
                    pcVar11 = (char *)mmap64((void *)0x0,local_c0.st_size + 1,1,1,uVar4,0);
                    local_430.memoryData = pcVar11;
                    if (pcVar11 == (char *)0xffffffffffffffff) {
                      close(uVar4);
                      bVar1 = false;
                      uVar4 = fprintf((FILE *)errStream,"mmap failure for file %s\n",pcVar8);
                      pcVar11 = (char *)(ulong)uVar4;
                      local_430.progresult = XMLLINT_ERR_RDFILE;
                      uVar4 = 3;
                    }
                    else {
                      local_430.memorySize = _Var2;
                      uVar4 = 0;
                      bVar1 = true;
                    }
                  }
                  iVar3 = (int)pcVar11;
                  if (!bVar1) goto LAB_00107ef9;
                }
                if ((local_430.timing != 0) && (1 < local_430.repeat)) {
                  gettimeofday((timeval *)&local_c0,(__timezone_ptr_t)0x0);
                  local_430.begin.sec = local_c0.st_dev;
                  local_430.begin.usec = (int)local_c0.st_ino;
                  iVar3 = (int)local_c0.st_ino;
                }
                if (local_430.stream == 0) {
                  if (local_430.html == 0) {
                    if (local_430.push == 0) {
                      pxVar14 = (xmlParserCtxtPtr)xmlNewParserCtxt();
                      pxVar13 = pxVar14;
                    }
                    else {
                      pxVar13 = (xmlParserCtxtPtr)xmlCreatePushParserCtxt(0,0,0,0,pcVar8);
                      pxVar14 = (xmlParserCtxtPtr)xmlCtxtUseOptions();
                    }
                  }
                  else if (local_430.push == 0) {
                    pxVar14 = (xmlParserCtxtPtr)htmlNewParserCtxt();
                    pxVar13 = pxVar14;
                  }
                  else {
                    pxVar13 = (xmlParserCtxtPtr)htmlCreatePushParserCtxt(0,0,0,0,pcVar8);
                    pxVar14 = (xmlParserCtxtPtr)htmlCtxtUseOptions();
                  }
                  iVar3 = (int)pxVar14;
                  if (pxVar13 == (xmlParserCtxtPtr)0x0) {
                    local_430.progresult = XMLLINT_ERR_MEM;
                    uVar4 = 2;
                  }
                  else {
                    if (local_430.sax != 0) {
                      __src = &debugSAXHandler;
                      if (((uint)local_430.options >> 9 & 1) == 0) {
                        __src = &debugSAX2Handler;
                      }
                      if (local_430.noout != 0) {
                        __src = &emptySAXHandler;
                      }
                      memcpy(pxVar13->sax,__src,0x100);
                      pxVar13->userData = &local_430;
                    }
                    xmlCtxtSetResourceLoader(pxVar13,xmllintResourceLoader,&local_430);
                    if (local_430.maxAmpl != 0) {
                      xmlCtxtSetMaxAmplification(pxVar13);
                    }
                    if (local_430.htmlout != 0) {
                      pxVar13->_private = &local_430;
                      xmlCtxtSetErrorHandler(pxVar13,xmlHTMLError,pxVar13);
                    }
                    local_430.ctxt = pxVar13;
                    if (0 < local_430.repeat) {
                      iVar3 = 0;
                      do {
                        if ((iVar3 != 0) && (local_430.push != 0)) {
                          xmlCtxtResetPush(pxVar13,0,0,0,0);
                        }
                        if (local_430.sax == 0) {
                          parseAndPrintFile(&local_430,pcVar8);
                        }
                        else {
                          local_430.callbacks = 0;
                          if (local_430.wxschemas == (xmlSchemaPtr)0x0) {
                            if (local_430.html == 0) {
                              parseXml(&local_430,pcVar8);
                            }
                            else {
                              parseHtml(&local_430,pcVar8);
                            }
                          }
                          else {
                            iVar17 = strcmp(pcVar8,"-");
                            if (iVar17 == 0) {
                              lVar10 = xmlParserInputBufferCreateFd(0);
                            }
                            else {
                              lVar10 = xmlParserInputBufferCreateFilename(pcVar8);
                            }
                            if (lVar10 != 0) {
                              lVar15 = xmlSchemaNewValidCtxt(local_430.wxschemas);
                              if (lVar15 == 0) {
                                local_430.progresult = XMLLINT_ERR_MEM;
                                xmlFreeParserInputBuffer(lVar10);
                              }
                              else {
                                xmlSchemaValidateSetFilename(lVar15,pcVar8);
                                iVar17 = xmlSchemaValidateStream(lVar15,lVar10,0);
                                if (local_430.repeat == 1) {
                                  if (iVar17 == 0) {
                                    if (local_430.quiet == 0) {
                                      fprintf((FILE *)local_430.errStream,"%s validates\n",pcVar8);
                                    }
                                  }
                                  else {
                                    if (iVar17 < 1) {
                                      pcVar11 = "%s validation generated an internal error\n";
                                    }
                                    else {
                                      pcVar11 = "%s fails to validate\n";
                                    }
                                    fprintf((FILE *)local_430.errStream,pcVar11,pcVar8);
                                    local_430.progresult = XMLLINT_ERR_VALID;
                                  }
                                }
                                xmlSchemaFreeValidCtxt(lVar15);
                              }
                            }
                          }
                        }
                        iVar3 = iVar3 + 1;
                      } while (iVar3 < local_430.repeat);
                    }
                    iVar3 = xmlFreeParserCtxt();
                    uVar4 = 0;
                  }
                  if (pxVar13 == (xmlParserCtxtPtr)0x0) goto LAB_00107ef9;
                }
                else if (0 < local_430.repeat) {
                  iVar17 = 0;
                  do {
                    __stream = local_430.errStream;
                    if (local_430.memory == 0) {
                      iVar3 = strcmp(pcVar8,"-");
                      if (iVar3 == 0) {
                        pxVar12 = (xmlTextReaderPtr)xmlReaderForFd(0,"-",0,local_430.options);
                        goto LAB_00107704;
                      }
                      xmlResetLastError();
                      lVar10 = xmlParserInputBufferCreateFilename(pcVar8);
                      if (lVar10 == 0) {
                        pxVar12 = (xmlTextReaderPtr)xmlGetLastError();
                        if ((pxVar12 == (xmlTextReaderPtr)0x0) || (*(int *)(pxVar12 + 4) != 2)) {
                          iVar3 = fprintf((FILE *)__stream,"Unable to open %s\n",pcVar8);
                          local_430.progresult = XMLLINT_ERR_RDFILE;
                          goto LAB_00107b70;
                        }
                        goto LAB_00107b65;
                      }
                      reader = (xmlTextReaderPtr)xmlNewTextReader(lVar10);
                      if ((reader != (xmlTextReaderPtr)0x0) &&
                         (pxVar12 = (xmlTextReaderPtr)xmlTextReaderSetup(reader,0,0,0),
                         -1 < (int)pxVar12)) goto LAB_0010770a;
                      local_430.progresult = XMLLINT_ERR_MEM;
                      iVar3 = xmlFreeParserInputBuffer(lVar10);
                    }
                    else {
                      pxVar12 = (xmlTextReaderPtr)
                                xmlReaderForMemory(local_430.memoryData,
                                                   local_430.memorySize & 0xffffffff,pcVar8);
LAB_00107704:
                      lVar10 = 0;
                      reader = pxVar12;
LAB_0010770a:
                      if (reader == (xmlTextReaderPtr)0x0) {
LAB_00107b65:
                        iVar3 = (int)pxVar12;
                        local_430.progresult = XMLLINT_ERR_MEM;
                      }
                      else {
                        if (((local_430.patternc != (xmlPatternPtr)0x0) &&
                            (local_430.patstream = (xmlStreamCtxtPtr)xmlPatternGetStreamCtxt(),
                            local_430.patstream != (xmlStreamCtxtPtr)0x0)) &&
                           (iVar3 = xmlStreamPush(local_430.patstream,0,0), iVar3 < 0)) {
                          fwrite("xmlStreamPush() failure\n",0x18,1,(FILE *)__stream);
                          xmlFreeStreamCtxt(local_430.patstream);
                          local_430.patstream = (xmlStreamCtxtPtr)0x0;
                        }
                        xmlTextReaderSetResourceLoader(reader,xmllintResourceLoader,&local_430);
                        if (local_430.maxAmpl != 0) {
                          xmlTextReaderSetMaxAmplification(reader);
                        }
                        if (local_430.relaxng != (char *)0x0) {
                          if ((local_430.timing != 0) && (local_430.repeat == 1)) {
                            gettimeofday((timeval *)&local_c0,(__timezone_ptr_t)0x0);
                            local_430.begin.sec = local_c0.st_dev;
                            local_430.begin.usec = (int)local_c0.st_ino;
                          }
                          iVar3 = xmlTextReaderRelaxNGValidate(reader);
                          if (iVar3 < 0) {
                            fprintf((FILE *)__stream,"Relax-NG schema %s failed to compile\n",
                                    local_430.relaxng);
                            local_430.progresult = XMLLINT_ERR_SCHEMACOMP;
                            local_430.relaxng = (char *)0x0;
                          }
                          if ((local_430.timing != 0) && (local_430.repeat == 1)) {
                            endTimer(&local_430,"Compiling the schemas");
                          }
                        }
                        if (local_430.schema != (char *)0x0) {
                          if ((local_430.timing != 0) && (local_430.repeat == 1)) {
                            gettimeofday((timeval *)&local_c0,(__timezone_ptr_t)0x0);
                            local_430.begin.sec = local_c0.st_dev;
                            local_430.begin.usec = (int)local_c0.st_ino;
                          }
                          iVar3 = xmlTextReaderSchemaValidate(reader);
                          if (iVar3 < 0) {
                            fprintf((FILE *)__stream,"XSD schema %s failed to compile\n",
                                    local_430.schema);
                            local_430.progresult = XMLLINT_ERR_SCHEMACOMP;
                            local_430.schema = (char *)0x0;
                          }
                          if ((local_430.timing != 0) && (local_430.repeat == 1)) {
                            endTimer(&local_430,"Compiling the schemas");
                          }
                        }
                        if ((local_430.timing != 0) && (local_430.repeat == 1)) {
                          gettimeofday((timeval *)&local_c0,(__timezone_ptr_t)0x0);
                          local_430.begin.sec = local_c0.st_dev;
                          local_430.begin.usec = (int)local_c0.st_ino;
                        }
                        while (iVar5 = xmlTextReaderRead(reader), iVar5 == 1) {
                          if ((local_430.debug != 0) || (local_430.patternc != (xmlPatternPtr)0x0))
                          {
                            processNode(&local_430,reader);
                          }
                        }
                        if ((local_430.timing != 0) && (local_430.repeat == 1)) {
                          pcVar11 = "Parsing and validating";
                          if ((local_430.options & 0x10U) == 0) {
                            pcVar11 = "Parsing";
                          }
                          if (local_430.relaxng != (char *)0x0) {
                            pcVar11 = "Parsing and validating";
                          }
                          endTimer(&local_430,pcVar11);
                        }
                        if (((local_430.options & 0x10U) != 0) &&
                           (iVar3 = xmlTextReaderIsValid(reader), iVar3 != 1)) {
                          fprintf((FILE *)__stream,"Document %s does not validate\n",pcVar8);
                          local_430.progresult = XMLLINT_ERR_VALID;
                        }
                        if (local_430.schema != (char *)0x0 || local_430.relaxng != (char *)0x0) {
                          iVar3 = xmlTextReaderIsValid(reader);
                          if (iVar3 == 1) {
                            if (local_430.quiet == 0) {
                              fprintf((FILE *)__stream,"%s validates\n",pcVar8);
                            }
                          }
                          else {
                            fprintf((FILE *)__stream,"%s fails to validate\n",pcVar8);
                            local_430.progresult = XMLLINT_ERR_VALID;
                          }
                        }
                        xmlFreeTextReader(reader);
                        iVar3 = xmlFreeParserInputBuffer(lVar10);
                        if (iVar5 != 0) {
                          iVar3 = fprintf((FILE *)__stream,"%s : failed to parse\n",pcVar8);
                          local_430.progresult = XMLLINT_ERR_UNCLASS;
                        }
                        if (local_430.patstream != (xmlStreamCtxtPtr)0x0) {
                          iVar3 = xmlFreeStreamCtxt();
                          local_430.patstream = (xmlStreamCtxtPtr)0x0;
                        }
                      }
                    }
LAB_00107b70:
                    iVar17 = iVar17 + 1;
                  } while (iVar17 < local_430.repeat);
                }
                if ((local_430.timing != 0) && (1 < local_430.repeat)) {
                  endTimer(&local_430,"%d iterations");
                  iVar3 = extraout_EAX;
                }
                local_438 = local_438 + 1;
                uVar4 = 0;
                if (local_430.memory != 0) {
                  munmap(local_430.memoryData,local_430.memorySize);
                  iVar3 = close(local_43c);
                }
              }
LAB_00107ef9:
              if (5 < uVar4) {
switchD_00107f12_caseD_1:
                return iVar3;
              }
              iVar3 = (&switchD_00107f12::switchdataD_0010e008)[uVar4] + 0x10e008;
              switch(uVar4) {
              case 1:
              case 4:
                goto switchD_00107f12_caseD_1;
              case 2:
                goto switchD_00107f12_caseD_2;
              case 3:
                goto switchD_00107f12_caseD_3;
              }
              iVar16 = iVar16 + 1;
            } while (iVar16 < argc);
switchD_00107f12_caseD_3:
            if (local_430.generate != 0) {
              parseAndPrintFile(&local_430,(char *)0x0);
            }
            if ((local_430.htmlout != 0) && (local_430.nowrap == 0)) {
              fwrite("</body></html>\n",0xf,1,(FILE *)errStream);
            }
            if (((local_438 != 0) || (local_430.generate != 0)) || (local_430.version != 0))
            goto switchD_00107f12_caseD_2;
            pcVar8 = *argv;
            goto LAB_00105e75;
          }
          if (-1 < iVar16) {
            fprintf((FILE *)errStream,"Pattern %s failed to compile\n",local_430.pattern);
            local_430.progresult = XMLLINT_ERR_SCHEMAPAT;
            goto switchD_00107f12_caseD_2;
          }
        }
      }
      else {
        if (local_430.schema == (char *)0x0 || local_430.stream != 0) goto LAB_001072ab;
        if (local_430.timing != 0) {
          gettimeofday((timeval *)&local_c0,(__timezone_ptr_t)0x0);
          local_430.begin.sec = local_c0.st_dev;
          local_430.begin.usec = (int)local_c0.st_ino;
        }
        lVar10 = xmlSchemaNewParserCtxt(local_430.schema);
        if (lVar10 != 0) {
          xmlSchemaSetResourceLoader(lVar10,xmllintResourceLoader,&local_430);
          local_430.wxschemas = (xmlSchemaPtr)xmlSchemaParse(lVar10);
          if (local_430.wxschemas != (xmlSchemaPtr)0x0) {
            xmlSchemaFreeParserCtxt(lVar10);
            goto LAB_0010728e;
          }
          pcVar11 = "WXS schema %s failed to compile\n";
          pcVar8 = local_430.schema;
          goto LAB_00108010;
        }
      }
    }
    else {
      local_430.options = local_430.options | 4;
      if (local_430.timing != 0) {
        gettimeofday((timeval *)&local_c0,(__timezone_ptr_t)0x0);
        local_430.begin.sec = local_c0.st_dev;
        local_430.begin.usec = (int)local_c0.st_ino;
      }
      lVar10 = xmlSchematronNewParserCtxt(local_430.schematron);
      if (lVar10 != 0) {
        local_430.wxschematron = (xmlSchematronPtr)xmlSchematronParse(lVar10);
        if (local_430.wxschematron != (xmlSchematronPtr)0x0) {
          xmlSchematronFreeParserCtxt(lVar10);
          if (local_430.timing != 0) {
            endTimer(&local_430,"Compiling the schemas");
          }
          goto LAB_0010713c;
        }
        pcVar11 = "Schematron schema %s failed to compile\n";
        pcVar8 = local_430.schematron;
LAB_00108010:
        fprintf((FILE *)errStream,pcVar11,pcVar8);
        local_430.progresult = XMLLINT_ERR_SCHEMACOMP;
        goto switchD_00107f12_caseD_2;
      }
    }
  }
  else {
    local_430.htmlBuf = (char *)(*_xmlMalloc)(50000);
    if (local_430.htmlBuf != (char *)0x0) {
      if (local_430.nowrap == 0) {
        fwrite("<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0 Transitional//EN\"\n",0x3e,1,
               (FILE *)errStream);
        fwrite("\t\"http://www.w3.org/TR/REC-html40/loose.dtd\">\n",0x2e,1,(FILE *)errStream);
        fprintf((FILE *)errStream,"<html><head><title>%s output</title></head>\n",*argv);
        fprintf((FILE *)errStream,"<body bgcolor=\"#ffffff\"><h1 align=\"center\">%s output</h1>\n",
                *argv);
      }
      goto LAB_00107084;
    }
  }
  local_430.progresult = XMLLINT_ERR_MEM;
switchD_00107f12_caseD_2:
  if (local_430.htmlout != 0) {
    (*_xmlFree)(local_430.htmlBuf);
  }
  if (local_430.wxschematron != (xmlSchematronPtr)0x0) {
    xmlSchematronFree();
  }
  if (local_430.relaxngschemas != (xmlRelaxNGPtr)0x0) {
    xmlRelaxNGFree();
  }
  if (local_430.wxschemas != (xmlSchemaPtr)0x0) {
    xmlSchemaFree();
  }
  if (local_430.patternc != (xmlPatternPtr)0x0) {
    xmlFreePattern();
  }
  xmlCleanupParser();
  if ((local_430.maxmem == 0) || ((xmllintMaxmemReached & 1) == 0)) {
    if (local_430.progresult == XMLLINT_ERR_MEM) {
      fwrite("Out-of-memory error reported\n",0x1d,1,(FILE *)errStream);
    }
  }
  else {
    fprintf((FILE *)errStream,"Maximum memory exceeded (%d bytes)\n",0);
  }
  return local_430.progresult;
}

Assistant:

int
xmllintMain(int argc, const char **argv, FILE *errStream,
            xmlResourceLoader loader) {
    xmllintState state, *lint;
    int i, j, res;
    int files = 0;

#ifdef _WIN32
    _setmode(_fileno(stdin), _O_BINARY);
    _setmode(_fileno(stdout), _O_BINARY);
    _setmode(_fileno(stderr), _O_BINARY);
#endif

    lint = &state;
    xmllintInit(lint);
    lint->errStream = errStream;
    lint->defaultResourceLoader = loader;

    res = xmllintParseOptions(lint, argc, argv);
    if (res != XMLLINT_RETURN_OK) {
        lint->progresult = res;
        goto error;
    }

    if (lint->maxmem != 0) {
        xmllintMaxmem = 0;
        xmllintMaxmemReached = 0;
        xmllintOom = 0;
        xmlMemSetup(myFreeFunc, myMallocFunc, myReallocFunc, myStrdupFunc);
    }

    LIBXML_TEST_VERSION

#ifdef LIBXML_CATALOG_ENABLED
    if (lint->nocatalogs == 0) {
	if (lint->catalogs) {
	    const char *catal;

	    catal = getenv("SGML_CATALOG_FILES");
	    if (catal != NULL) {
		xmlLoadCatalogs(catal);
	    } else {
		fprintf(errStream, "Variable $SGML_CATALOG_FILES not set\n");
	    }
	}
    }
#endif

#ifdef LIBXML_OUTPUT_ENABLED
    {
        const char *indent = getenv("XMLLINT_INDENT");
        if (indent != NULL) {
            xmlTreeIndentString = indent;
        }
    }
#endif

    if (lint->htmlout) {
        lint->htmlBuf = xmlMalloc(HTML_BUF_SIZE);
        if (lint->htmlBuf == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            goto error;
        }

        if (!lint->nowrap) {
            fprintf(errStream,
             "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0 Transitional//EN\"\n");
            fprintf(errStream,
                    "\t\"http://www.w3.org/TR/REC-html40/loose.dtd\">\n");
            fprintf(errStream,
             "<html><head><title>%s output</title></head>\n",
                    argv[0]);
            fprintf(errStream,
             "<body bgcolor=\"#ffffff\"><h1 align=\"center\">%s output</h1>\n",
                    argv[0]);
        }
    }

#ifdef LIBXML_SCHEMATRON_ENABLED
    if ((lint->schematron != NULL) && (lint->sax == 0)
#ifdef LIBXML_READER_ENABLED
        && (lint->stream == 0)
#endif /* LIBXML_READER_ENABLED */
	) {
	xmlSchematronParserCtxtPtr ctxt;

        /* forces loading the DTDs */
	lint->options |= XML_PARSE_DTDLOAD;
	if (lint->timing) {
	    startTimer(lint);
	}
	ctxt = xmlSchematronNewParserCtxt(lint->schematron);
        if (ctxt == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            goto error;
        }
	lint->wxschematron = xmlSchematronParse(ctxt);
	if (lint->wxschematron == NULL) {
	    fprintf(errStream, "Schematron schema %s failed to compile\n",
                    lint->schematron);
            lint->progresult = XMLLINT_ERR_SCHEMACOMP;
            goto error;
	}
	xmlSchematronFreeParserCtxt(ctxt);
	if (lint->timing) {
	    endTimer(lint, "Compiling the schemas");
	}
    }
#endif

#ifdef LIBXML_SCHEMAS_ENABLED
    if ((lint->relaxng != NULL) && (lint->sax == 0)
#ifdef LIBXML_READER_ENABLED
        && (lint->stream == 0)
#endif /* LIBXML_READER_ENABLED */
	) {
	xmlRelaxNGParserCtxtPtr ctxt;

        /* forces loading the DTDs */
	lint->options |= XML_PARSE_DTDLOAD;
	if (lint->timing) {
	    startTimer(lint);
	}
	ctxt = xmlRelaxNGNewParserCtxt(lint->relaxng);
        if (ctxt == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            goto error;
        }
        xmlRelaxNGSetResourceLoader(ctxt, xmllintResourceLoader, lint);
	lint->relaxngschemas = xmlRelaxNGParse(ctxt);
	if (lint->relaxngschemas == NULL) {
	    fprintf(errStream, "Relax-NG schema %s failed to compile\n",
                    lint->relaxng);
            lint->progresult = XMLLINT_ERR_SCHEMACOMP;
            goto error;
	}
	xmlRelaxNGFreeParserCtxt(ctxt);
	if (lint->timing) {
	    endTimer(lint, "Compiling the schemas");
	}
    } else if ((lint->schema != NULL)
#ifdef LIBXML_READER_ENABLED
		&& (lint->stream == 0)
#endif
	) {
	xmlSchemaParserCtxtPtr ctxt;

	if (lint->timing) {
	    startTimer(lint);
	}
	ctxt = xmlSchemaNewParserCtxt(lint->schema);
        if (ctxt == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            goto error;
        }
        xmlSchemaSetResourceLoader(ctxt, xmllintResourceLoader, lint);
	lint->wxschemas = xmlSchemaParse(ctxt);
	if (lint->wxschemas == NULL) {
	    fprintf(errStream, "WXS schema %s failed to compile\n",
                    lint->schema);
            lint->progresult = XMLLINT_ERR_SCHEMACOMP;
            goto error;
	}
	xmlSchemaFreeParserCtxt(ctxt);
	if (lint->timing) {
	    endTimer(lint, "Compiling the schemas");
	}
    }
#endif /* LIBXML_SCHEMAS_ENABLED */

#if defined(LIBXML_READER_ENABLED) && defined(LIBXML_PATTERN_ENABLED)
    if ((lint->pattern != NULL) && (lint->walker == 0)) {
        res = xmlPatternCompileSafe(BAD_CAST lint->pattern, NULL, 0, NULL,
                                    &lint->patternc);
	if (lint->patternc == NULL) {
            if (res < 0) {
                lint->progresult = XMLLINT_ERR_MEM;
            } else {
                fprintf(errStream, "Pattern %s failed to compile\n",
                        lint->pattern);
                lint->progresult = XMLLINT_ERR_SCHEMAPAT;
            }
            goto error;
	}
    }
#endif /* LIBXML_READER_ENABLED && LIBXML_PATTERN_ENABLED */

    /*
     * The main loop over input documents
     */
    for (i = 1; i < argc ; i++) {
        const char *filename = argv[i];
#if HAVE_DECL_MMAP
        int memoryFd = -1;
#endif

	if ((filename[0] == '-') && (strcmp(filename, "-") != 0)) {
            i += skipArgs(filename);
            continue;
        }

#if HAVE_DECL_MMAP
        if (lint->memory) {
            struct stat info;
            if (stat(filename, &info) < 0) {
                lint->progresult = XMLLINT_ERR_RDFILE;
                break;
            }
            memoryFd = open(filename, O_RDONLY);
            if (memoryFd < 0) {
                lint->progresult = XMLLINT_ERR_RDFILE;
                break;
            }
            lint->memoryData = mmap(NULL, info.st_size + 1, PROT_READ,
                                    MAP_SHARED, memoryFd, 0);
            if (lint->memoryData == (void *) MAP_FAILED) {
                close(memoryFd);
                fprintf(errStream, "mmap failure for file %s\n", filename);
                lint->progresult = XMLLINT_ERR_RDFILE;
                break;
            }
            lint->memorySize = info.st_size;
        }
#endif /* HAVE_DECL_MMAP */

	if ((lint->timing) && (lint->repeat > 1))
	    startTimer(lint);

#ifdef LIBXML_READER_ENABLED
        if (lint->stream != 0) {
            for (j = 0; j < lint->repeat; j++)
                streamFile(lint, filename);
        } else
#endif /* LIBXML_READER_ENABLED */
        {
            xmlParserCtxtPtr ctxt;

#ifdef LIBXML_HTML_ENABLED
            if (lint->html) {
#ifdef LIBXML_PUSH_ENABLED
                if (lint->push) {
                    ctxt = htmlCreatePushParserCtxt(NULL, NULL, NULL, 0,
                                                    filename,
                                                    XML_CHAR_ENCODING_NONE);
                    htmlCtxtUseOptions(ctxt, lint->options);
                } else
#endif /* LIBXML_PUSH_ENABLED */
                {
                    ctxt = htmlNewParserCtxt();
                }
            } else
#endif /* LIBXML_HTML_ENABLED */
            {
#ifdef LIBXML_PUSH_ENABLED
                if (lint->push) {
                    ctxt = xmlCreatePushParserCtxt(NULL, NULL, NULL, 0,
                                                   filename);
                    xmlCtxtUseOptions(ctxt, lint->options);
                } else
#endif /* LIBXML_PUSH_ENABLED */
                {
                    ctxt = xmlNewParserCtxt();
                }
            }
            if (ctxt == NULL) {
                lint->progresult = XMLLINT_ERR_MEM;
                goto error;
            }

            if (lint->sax) {
                const xmlSAXHandler *handler;

                if (lint->noout) {
                    handler = &emptySAXHandler;
#ifdef LIBXML_SAX1_ENABLED
                } else if (lint->options & XML_PARSE_SAX1) {
                    handler = &debugSAXHandler;
#endif
                } else {
                    handler = &debugSAX2Handler;
                }

                *ctxt->sax = *handler;
                ctxt->userData = lint;
            }

            xmlCtxtSetResourceLoader(ctxt, xmllintResourceLoader, lint);
            if (lint->maxAmpl > 0)
                xmlCtxtSetMaxAmplification(ctxt, lint->maxAmpl);

            if (lint->htmlout) {
                ctxt->_private = lint;
                xmlCtxtSetErrorHandler(ctxt, xmlHTMLError, ctxt);
            }

            lint->ctxt = ctxt;

            for (j = 0; j < lint->repeat; j++) {
#ifdef LIBXML_PUSH_ENABLED
                if ((lint->push) && (j > 0))
                    xmlCtxtResetPush(ctxt, NULL, 0, NULL, NULL);
#endif
                if (lint->sax) {
                    testSAX(lint, filename);
                } else {
                    parseAndPrintFile(lint, filename);
                }
            }

            xmlFreeParserCtxt(ctxt);
        }

        if ((lint->timing) && (lint->repeat > 1)) {
            endTimer(lint, "%d iterations", lint->repeat);
        }

        files += 1;

#if HAVE_DECL_MMAP
        if (lint->memory) {
            munmap(lint->memoryData, lint->memorySize);
            close(memoryFd);
        }
#endif
    }

    if (lint->generate)
	parseAndPrintFile(lint, NULL);

    if ((lint->htmlout) && (!lint->nowrap)) {
	fprintf(errStream, "</body></html>\n");
    }

    if ((files == 0) && (!lint->generate) && (lint->version == 0)) {
	usage(errStream, argv[0]);
        lint->progresult = XMLLINT_ERR_UNCLASS;
    }

error:

    if (lint->htmlout)
        xmlFree(lint->htmlBuf);

#ifdef LIBXML_SCHEMATRON_ENABLED
    if (lint->wxschematron != NULL)
	xmlSchematronFree(lint->wxschematron);
#endif
#ifdef LIBXML_SCHEMAS_ENABLED
    if (lint->relaxngschemas != NULL)
	xmlRelaxNGFree(lint->relaxngschemas);
    if (lint->wxschemas != NULL)
	xmlSchemaFree(lint->wxschemas);
#endif
#if defined(LIBXML_READER_ENABLED) && defined(LIBXML_PATTERN_ENABLED)
    if (lint->patternc != NULL)
        xmlFreePattern(lint->patternc);
#endif

    xmlCleanupParser();

    if ((lint->maxmem) && (xmllintMaxmemReached)) {
        fprintf(errStream, "Maximum memory exceeded (%d bytes)\n",
                xmllintMaxmem);
    } else if (lint->progresult == XMLLINT_ERR_MEM) {
        fprintf(errStream, "Out-of-memory error reported\n");
    }

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if ((lint->maxmem) &&
        (xmllintOom != (lint->progresult == XMLLINT_ERR_MEM))) {
        fprintf(stderr, "xmllint: malloc failure %s reported\n",
                xmllintOom ? "not" : "erroneously");
        abort();
    }
#endif

    return(lint->progresult);
}